

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

bool __thiscall QCss::Parser::parseMedia(Parser *this,MediaRule *mediaRule)

{
  bool bVar1;
  long in_FS_OFFSET;
  StyleRule local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    skipSpace(this);
    bVar1 = parseNextMedium(this,&mediaRule->media);
    if (!bVar1) goto LAB_00545e90;
    bVar1 = test(this,COMMA);
  } while (bVar1);
  bVar1 = next(this,LBRACE);
  if (bVar1) {
    skipSpace(this);
    while( true ) {
      bVar1 = testSimpleSelector(this);
      if (!bVar1) break;
      local_68.selectors.d.d = (Data *)0x0;
      local_68.selectors.d.ptr = (Selector *)0x0;
      local_68.selectors.d.size = 0;
      local_68.declarations.d.d = (Data *)0x0;
      local_68.declarations.d.ptr = (Declaration *)0x0;
      local_68.declarations.d.size = 0;
      local_68.order = 0;
      local_68._52_4_ = 0xaaaaaaaa;
      bVar1 = parseRuleset(this,&local_68);
      if (!bVar1) {
        StyleRule::~StyleRule(&local_68);
        goto LAB_00545e90;
      }
      QList<QCss::StyleRule>::emplaceBack<QCss::StyleRule_const&>(&mediaRule->styleRules,&local_68);
      StyleRule::~StyleRule(&local_68);
    }
    bVar1 = next(this,RBRACE);
    if (bVar1) {
      skipSpace(this);
      bVar1 = true;
      goto LAB_00545e92;
    }
  }
LAB_00545e90:
  bVar1 = false;
LAB_00545e92:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool Parser::parseMedia(MediaRule *mediaRule)
{
    do {
        skipSpace();
        if (!parseNextMedium(&mediaRule->media)) return false;
    } while (test(COMMA));

    if (!next(LBRACE)) return false;
    skipSpace();

    while (testRuleset()) {
        StyleRule rule;
        if (!parseRuleset(&rule)) return false;
        mediaRule->styleRules.append(rule);
    }

    if (!next(RBRACE)) return false;
    skipSpace();
    return true;
}